

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O2

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::ModifierData>
          (Structure *this,ModifierData *dest,FileDatabase *db)

{
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::ElemBase>(this,&dest->next,"*next",db,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::ElemBase>(this,&dest->prev,"*prev",db,false);
  ReadField<1,int>(this,&dest->type,"type",db);
  ReadField<1,int>(this,&dest->mode,"mode",db);
  ReadFieldArray<1,char,32ul>(this,&dest->name,"name",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<ModifierData> (
    ModifierData& dest,
    const FileDatabase& db
    ) const
{

    ReadFieldPtr<ErrorPolicy_Warn>(dest.next,"*next",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.prev,"*prev",db);
    ReadField<ErrorPolicy_Igno>(dest.type,"type",db);
    ReadField<ErrorPolicy_Igno>(dest.mode,"mode",db);
    ReadFieldArray<ErrorPolicy_Igno>(dest.name,"name",db);

    db.reader->IncPtr(size);
}